

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall IlmThread_2_5::Task::Task(Task *this,TaskGroup *g)

{
  Data *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Task_00111ba0;
  in_RDI[1] = in_RSI;
  if (in_RSI != (Data *)0x0) {
    TaskGroup::Data::addTask(in_RSI);
  }
  return;
}

Assistant:

Task::Task (TaskGroup* g): _group(g)
{
    if ( g )
        g->_data->addTask ();
}